

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O0

bool is_vowel(char ch)

{
  char cVar1;
  int iVar2;
  bool local_9;
  char ch_local;
  
  iVar2 = tolower((int)ch);
  cVar1 = (char)iVar2;
  if ((((cVar1 == 'a') || (cVar1 == 'e')) || (cVar1 == 'i')) ||
     (((cVar1 == 'o' || (cVar1 == 'u')) || (cVar1 == 'y')))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool is_vowel(char ch)
{
	switch (static_cast<char>(std::tolower(ch)))
	{
	case 'a':
	case 'e':
	case 'i':
	case 'o':
	case 'u':
	case 'y':
		return true;
	default:
		return false;
	}
}